

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

void __thiscall mkvmuxer::Segment::MoveCuesBeforeClusters(Segment *this)

{
  uint32_t uVar1;
  int32_t i;
  uint64_t uVar2;
  uint64_t value;
  uint64 uVar3;
  ulong uVar4;
  int32_t index;
  long lVar5;
  ulong uVar6;
  uint64_t uVar7;
  ulong uVar8;
  uint64_t local_38;
  
  uVar2 = Cues::Size(&this->cues_);
  local_38 = 0;
  if ((this->cues_).cue_entries_size_ < 1) {
    uVar7 = 0;
  }
  else {
    lVar5 = 0;
    uVar7 = 0;
    do {
      value = CuePoint::PayloadSize((this->cues_).cue_entries_[lVar5]);
      uVar3 = EbmlMasterElementSize(0xbb,value);
      uVar7 = uVar7 + value + uVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->cues_).cue_entries_size_);
  }
  local_38 = uVar7;
  if (0 < (this->cues_).cue_entries_size_) {
    index = 0;
    do {
      MoveCuesBeforeClustersHelper(this,uVar2,index,&local_38);
      index = index + 1;
    } while (index < (this->cues_).cue_entries_size_);
  }
  uVar4 = 0;
  uVar8 = 0;
  uVar6 = 0;
  do {
    uVar1 = (this->seek_head_).seek_entry_id_[uVar4];
    if (uVar1 == 0x1f43b675) {
      uVar6 = uVar4 & 0xffffffff;
    }
    if (uVar1 == 0x1c53bb6b) {
      uVar8 = uVar4 & 0xffffffff;
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 5);
  uVar2 = 0xffffffffffffffff;
  if ((uint)uVar6 < 5) {
    uVar2 = (this->seek_head_).seek_entry_pos_[uVar6];
  }
  if ((uint)uVar8 < 5) {
    (this->seek_head_).seek_entry_id_[uVar8] = 0x1c53bb6b;
    (this->seek_head_).seek_entry_pos_[uVar8] = uVar2;
  }
  uVar7 = Cues::Size(&this->cues_);
  uVar2 = 0xffffffffffffffff;
  if ((uint)uVar8 < 5) {
    uVar2 = (this->seek_head_).seek_entry_pos_[uVar8];
  }
  if ((uint)uVar6 < 5) {
    (this->seek_head_).seek_entry_id_[uVar6] = 0x1f43b675;
    (this->seek_head_).seek_entry_pos_[uVar6] = uVar2 + uVar7;
  }
  return;
}

Assistant:

void Segment::MoveCuesBeforeClusters() {
  const uint64_t current_cue_size = cues_.Size();
  uint64_t cue_size = 0;
  for (int32_t i = 0; i < cues_.cue_entries_size(); ++i)
    cue_size += cues_.GetCueByIndex(i)->Size();
  for (int32_t i = 0; i < cues_.cue_entries_size(); ++i)
    MoveCuesBeforeClustersHelper(current_cue_size, i, &cue_size);

  // Adjust the Seek Entry to reflect the change in position
  // of Cluster and Cues
  int32_t cluster_index = 0;
  int32_t cues_index = 0;
  for (int32_t i = 0; i < SeekHead::kSeekEntryCount; ++i) {
    if (seek_head_.GetId(i) == libwebm::kMkvCluster)
      cluster_index = i;
    if (seek_head_.GetId(i) == libwebm::kMkvCues)
      cues_index = i;
  }
  seek_head_.SetSeekEntry(cues_index, libwebm::kMkvCues,
                          seek_head_.GetPosition(cluster_index));
  seek_head_.SetSeekEntry(cluster_index, libwebm::kMkvCluster,
                          cues_.Size() + seek_head_.GetPosition(cues_index));
}